

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

error confirm_type(token *token,token_type type)

{
  char *pcVar1;
  char *pcVar2;
  size_type sVar3;
  const_pointer pvVar4;
  token_type in_EDX;
  undefined4 in_register_00000034;
  token *token_00;
  undefined1 local_30 [8];
  string_view tkninfo;
  token_type type_local;
  token *token_local;
  
  token_00 = (token *)CONCAT44(in_register_00000034,type);
  if (token_00->type == in_EDX) {
    memset(token,0,8);
    error::error((error *)token);
  }
  else if (token_00->type == none) {
    pcVar1 = name(in_EDX);
    fail(token,(char *)token_00,"expected \x1b[1m%s\x1b[0m",pcVar1);
  }
  else {
    tkninfo._M_str._4_4_ = in_EDX;
    _local_30 = info(token_00);
    pcVar1 = name(tkninfo._M_str._4_4_);
    pcVar2 = name(token_00->type);
    sVar3 = std::size<std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    pvVar4 = std::data<std::basic_string_view<char,std::char_traits<char>>>
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
    fail(token,(char *)token_00,"expected \x1b[1m%s\x1b[0m and got \x1b[1m%s %.*s\x1b[0m",pcVar1,
         pcVar2,sVar3 & 0xffffffff,pvVar4);
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)token;
}

Assistant:

error confirm_type(const token& token, token_type type)
{
    if (token.type == type) {
        return {};
    }
    if (token.type == token_type::none) {
        return fail(token, "expected \33[1m%s\33[0m", name(type));
    }
    const std::string_view tkninfo = info(token);
    return fail(token, "expected \33[1m%s\33[0m and got \33[1m%s %.*s\33[0m", name(type),
                name(token.type), static_cast<int>(std::size(tkninfo)), std::data(tkninfo));
}